

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O2

exr_result_t
add_to_list(_internal_exr_context *ctxt,exr_attribute_list_t *list,exr_attribute_t *nattr,char *name
           )

{
  uint uVar1;
  exr_attribute_t **ppeVar2;
  exr_attribute_t *peVar3;
  int iVar4;
  exr_result_t eVar5;
  exr_attribute_t **ppeVar6;
  exr_attr_chromaticities_t *peVar7;
  exr_attr_m33d_t *peVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  exr_attribute_t **ppeVar12;
  
  uVar1 = list->num_attributes;
  lVar10 = (long)(int)uVar1;
  if ((int)uVar1 < list->num_alloced) {
    ppeVar6 = list->entries;
    ppeVar12 = list->sorted_entries;
  }
  else {
    uVar11 = (long)list->num_alloced * 2;
    uVar9 = lVar10 + 2;
    if (lVar10 + 1U <= uVar11) {
      uVar9 = uVar11;
    }
    ppeVar6 = (exr_attribute_t **)(*ctxt->alloc_fn)(uVar9 << 4);
    if (ppeVar6 == (exr_attribute_t **)0x0) {
      (*ctxt->free_fn)(nattr);
      eVar5 = (*ctxt->standard_error)(ctxt,1);
      return eVar5;
    }
    list->num_alloced = (int)uVar9;
    ppeVar12 = ppeVar6 + uVar9;
    uVar11 = 0;
    uVar9 = 0;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    for (; ppeVar2 = list->entries, uVar9 != uVar11; uVar11 = uVar11 + 1) {
      ppeVar6[uVar11] = ppeVar2[uVar11];
      ppeVar12[uVar11] = list->sorted_entries[uVar11];
    }
    if (ppeVar2 != (exr_attribute_t **)0x0) {
      (*ctxt->free_fn)(ppeVar2);
    }
    list->entries = ppeVar6;
    list->sorted_entries = ppeVar12;
  }
  ppeVar6[lVar10] = nattr;
  ppeVar12[lVar10] = nattr;
  for (uVar11 = (ulong)uVar1; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
    peVar3 = ppeVar12[uVar11 - 1];
    iVar4 = strcmp(nattr->name,peVar3->name);
    if (-1 < iVar4) break;
    ppeVar12[uVar11] = peVar3;
    ppeVar12[uVar11 - 1] = nattr;
  }
  list->num_attributes = (int)(lVar10 + 1U);
  switch(nattr->type) {
  case EXR_ATTR_BOX2I:
  case EXR_ATTR_BOX2F:
  case EXR_ATTR_CHLIST:
  case EXR_ATTR_FLOAT_VECTOR:
  case EXR_ATTR_STRING:
  case EXR_ATTR_STRING_VECTOR:
  case EXR_ATTR_V2D:
    peVar8 = (nattr->field_6).m33d;
    goto LAB_00114e64;
  case EXR_ATTR_CHROMATICITIES:
    peVar8 = (nattr->field_6).m33d;
    goto LAB_00114e4c;
  case EXR_ATTR_COMPRESSION:
  case EXR_ATTR_ENVMAP:
  case EXR_ATTR_LINEORDER:
    (nattr->field_6).uc = '\0';
    break;
  case EXR_ATTR_DOUBLE:
    (nattr->field_6).d = 0.0;
    break;
  case EXR_ATTR_FLOAT:
  case EXR_ATTR_INT:
    (nattr->field_6).f = 0.0;
    break;
  case EXR_ATTR_KEYCODE:
    peVar8 = (nattr->field_6).m33d;
    *(undefined8 *)((long)peVar8->m + 0xc) = 0;
    *(undefined8 *)((long)peVar8->m + 0x14) = 0;
    goto LAB_00114e64;
  case EXR_ATTR_M33F:
    peVar8 = (nattr->field_6).m33d;
    peVar8->m[2] = 0.0;
    peVar8->m[3] = 0.0;
    peVar8->m[0] = 0.0;
    peVar8->m[1] = 0.0;
    *(undefined4 *)(peVar8->m + 4) = 0;
    break;
  case EXR_ATTR_M33D:
    peVar8 = (nattr->field_6).m33d;
    peVar8->m[6] = 0.0;
    peVar8->m[7] = 0.0;
    peVar8->m[4] = 0.0;
    peVar8->m[5] = 0.0;
    peVar8->m[2] = 0.0;
    peVar8->m[3] = 0.0;
    peVar8->m[0] = 0.0;
    peVar8->m[1] = 0.0;
    peVar8->m[8] = 0.0;
    break;
  case EXR_ATTR_M44F:
  case EXR_ATTR_M44D:
    peVar8 = (nattr->field_6).m33d;
    peVar8->m[6] = 0.0;
    peVar8->m[7] = 0.0;
    peVar8->m[4] = 0.0;
    peVar8->m[5] = 0.0;
LAB_00114e4c:
    peVar8->m[2] = 0.0;
    peVar8->m[3] = 0.0;
LAB_00114e64:
    peVar8->m[0] = 0.0;
    peVar8->m[1] = 0.0;
    break;
  case EXR_ATTR_PREVIEW:
  case EXR_ATTR_V3D:
    peVar8 = (nattr->field_6).m33d;
    peVar8->m[0] = 0.0;
    peVar8->m[1] = 0.0;
    peVar8->m[2] = 0.0;
    break;
  case EXR_ATTR_RATIONAL:
  case EXR_ATTR_TIMECODE:
  case EXR_ATTR_V2I:
  case EXR_ATTR_V2F:
    peVar7 = (exr_attr_chromaticities_t *)(nattr->field_6).m33d;
    goto LAB_00114e2b;
  case EXR_ATTR_TILEDESC:
    peVar7 = (exr_attr_chromaticities_t *)(nattr->field_6).m33d;
    *(undefined1 *)&peVar7->green_x = 0;
    goto LAB_00114e2b;
  case EXR_ATTR_V3I:
  case EXR_ATTR_V3F:
    peVar7 = (nattr->field_6).chromaticities;
    peVar7->green_x = 0.0;
LAB_00114e2b:
    peVar7->red_x = 0.0;
    peVar7->red_y = 0.0;
    break;
  case EXR_ATTR_OPAQUE:
    peVar8 = (nattr->field_6).m33d;
    peVar8->m[4] = 0.0;
    peVar8->m[5] = 0.0;
    peVar8->m[2] = 0.0;
    peVar8->m[3] = 0.0;
    peVar8->m[0] = 0.0;
    peVar8->m[1] = 0.0;
    peVar8->m[6] = 0.0;
    break;
  default:
    (*ctxt->print_error)(ctxt,3,"Invalid / unimplemented type (%s) in attr_init",nattr->type_name);
    exr_attr_list_remove((exr_context_t)ctxt,list,nattr);
    return 3;
  }
  return 0;
}

Assistant:

static exr_result_t
add_to_list (
    struct _internal_exr_context* ctxt,
    exr_attribute_list_t*         list,
    exr_attribute_t*              nattr,
    const char*                   name)
{
    int               cattrsz = list->num_attributes;
    int               nattrsz = cattrsz + 1;
    int               insertpos;
    exr_attribute_t** attrs        = list->entries;
    exr_attribute_t** sorted_attrs = list->sorted_entries;
    exr_result_t      rv           = EXR_ERR_SUCCESS;

    (void) name;
    if (nattrsz > list->num_alloced)
    {
        size_t nsize = (size_t) (list->num_alloced) * 2;
        if ((size_t) nattrsz > nsize) nsize = (size_t) (nattrsz) + 1;
        attrs = (exr_attribute_t**) ctxt->alloc_fn (
            sizeof (exr_attribute_t*) * nsize * 2);
        if (!attrs)
        {
            ctxt->free_fn (nattr);
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }

        list->num_alloced = (int32_t) nsize;
        sorted_attrs      = attrs + nsize;

        for (int i = 0; i < cattrsz; ++i)
        {
            attrs[i]        = list->entries[i];
            sorted_attrs[i] = list->sorted_entries[i];
        }

        if (list->entries) ctxt->free_fn (list->entries);
        list->entries        = attrs;
        list->sorted_entries = sorted_attrs;
    }
    attrs[cattrsz]        = nattr;
    sorted_attrs[cattrsz] = nattr;
    insertpos             = cattrsz - 1;

    // FYI: qsort is shockingly slow, just do a quick search and
    // bubble it up until it's in the correct location
    while (insertpos >= 0)
    {
        exr_attribute_t* prev = sorted_attrs[insertpos];

        if (strcmp (nattr->name, prev->name) >= 0) break;

        sorted_attrs[insertpos + 1] = prev;
        sorted_attrs[insertpos]     = nattr;
        --insertpos;
    }

    list->num_attributes = nattrsz;
    rv                   = attr_init (ctxt, nattr);
    if (rv != EXR_ERR_SUCCESS)
        exr_attr_list_remove ((exr_context_t) ctxt, list, nattr);
    return rv;
}